

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall json11::Json::Json(Json *this,char *value)

{
  shared_ptr<json11::JsonString> local_28;
  char *local_18;
  char *value_local;
  Json *this_local;
  
  local_18 = value;
  value_local = (char *)this;
  std::make_shared<json11::JsonString,char_const*&>((char **)&local_28);
  std::shared_ptr<json11::JsonValue>::shared_ptr<json11::JsonString,void>(&this->m_ptr,&local_28);
  std::shared_ptr<json11::JsonString>::~shared_ptr(&local_28);
  return;
}

Assistant:

Json::Json(const char * value)         : m_ptr(make_shared<JsonString>(value)) {}